

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1518.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  char *redirectUrl;
  char *effectiveUrl;
  long curlRedirectCount;
  long curlResponseCode;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40 [2];
  undefined4 local_38 [2];
  
  local_48 = 0;
  local_50 = 0;
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    iVar1 = 0x7e;
  }
  else {
    iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
    if ((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x34,0), iVar1 == 0)) {
      iVar1 = curl_easy_perform(lVar2);
      curl_easy_getinfo(lVar2,0x200002,local_38);
      curl_easy_getinfo(lVar2,0x200014,local_40);
      curl_easy_getinfo(lVar2,0x100001,&local_48);
      curl_easy_getinfo(lVar2,0x10001f,&local_50);
      curl_mprintf("res: %d\nstatus: %d\nredirects: %d\neffectiveurl: %s\nredirecturl: %s\n",iVar1,
                   local_38[0],local_40[0],local_48,local_50);
    }
    curl_easy_cleanup(lVar2);
    curl_global_cleanup();
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  long curlResponseCode;
  long curlRedirectCount;
  char *effectiveUrl = NULL;
  char *redirectUrl = NULL;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  /* just to make it explicit and visible in this test: */
  test_setopt(curl, CURLOPT_FOLLOWLOCATION, 0L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

  curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &curlResponseCode);
  curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &curlRedirectCount);
  curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &effectiveUrl);
  curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &redirectUrl);

  printf("res: %d\n"
         "status: %d\n"
         "redirects: %d\n"
         "effectiveurl: %s\n"
         "redirecturl: %s\n",
         (int)res,
         (int)curlResponseCode,
         (int)curlRedirectCount,
         effectiveUrl,
         redirectUrl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}